

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringData.cpp
# Opt level: O0

void __thiscall StringData::printStringDataUtil(StringData *this,StringDataStruct *sdStruct)

{
  int iVar1;
  ostream *poVar2;
  iterator iVar3;
  iterator iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  int local_1c;
  StringDataStruct *pSStack_18;
  int len;
  StringDataStruct *sdStruct_local;
  StringData *this_local;
  
  pSStack_18 = sdStruct;
  sdStruct_local = (StringDataStruct *)this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_38,&sdStruct->CountCharacters);
  iVar1 = Utils::lenTwoBytes(&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  local_1c = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"      CountCharacters:              ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
  poVar2 = std::operator<<(poVar2," Unicode characters, ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::dec);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c << 1);
  poVar2 = std::operator<<(poVar2," bytes. ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"      String:                       ");
  iVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&sdStruct->String);
  iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&sdStruct->String);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar4._M_current);
  Utils::print_vec_unicode(&sdStruct->String);
  iVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&sdStruct->String);
  iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&sdStruct->String);
  std::
  reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )iVar4._M_current);
  return;
}

Assistant:

void StringData::printStringDataUtil(StringDataStruct sdStruct) {
    int len = Utils::lenTwoBytes(sdStruct.CountCharacters);
    cout << "      CountCharacters:              " << dec << len << " Unicode characters, "
         << dec << len * 2 << " bytes. " << endl;
    cout << "      String:                       ";
    reverse(sdStruct.String.begin(), sdStruct.String.end());
    Utils::print_vec_unicode(sdStruct.String);
    reverse(sdStruct.String.begin(), sdStruct.String.end());
}